

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_channel_destroy(ssh1_channel *c)

{
  ssh1_connection_state *ctx;
  ssh1_connection_state *s;
  ssh1_channel *c_local;
  
  ctx = c->connlayer;
  ssh1_channel_close_local(c,(char *)0x0);
  del234(ctx->channels,c);
  ssh1_channel_free(c);
  queue_toplevel_callback(ssh1_check_termination_callback,ctx);
  return;
}

Assistant:

static void ssh1_channel_destroy(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;

    ssh1_channel_close_local(c, NULL);
    del234(s->channels, c);
    ssh1_channel_free(c);

    /*
     * If that was the last channel left open, we might need to
     * terminate. But we'll be a bit cautious, by doing that in a
     * toplevel callback, just in case anything on the current call
     * stack objects to this entire PPL being freed.
     */
    queue_toplevel_callback(ssh1_check_termination_callback, s);
}